

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mthrowu.c
# Opt level: O0

void m_useup(monst *mon,obj *obj)

{
  uint uVar1;
  obj *obj_local;
  monst *mon_local;
  
  if (obj->quan < 2) {
    obj_extract_self(obj);
    possibly_unwield(mon,'\0');
    if (obj->owornmask != 0) {
      mon->misc_worn_check = (obj->owornmask ^ 0xffffffffU) & mon->misc_worn_check;
      update_mon_intrinsics(level,mon,obj,'\0','\0');
    }
    obfree(obj,(obj *)0x0);
  }
  else {
    obj->quan = obj->quan + -1;
    uVar1 = weight(obj);
    obj->owt = uVar1;
  }
  return;
}

Assistant:

void m_useup(struct monst *mon, struct obj *obj)
{
	if (obj->quan > 1L) {
		obj->quan--;
		obj->owt = weight(obj);
	} else {
		obj_extract_self(obj);
		possibly_unwield(mon, FALSE);
		if (obj->owornmask) {
		    mon->misc_worn_check &= ~obj->owornmask;
		    update_mon_intrinsics(level, mon, obj, FALSE, FALSE);
		}
		obfree(obj, NULL);
	}
}